

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

string * __thiscall cppcms::json::value::get_abi_cxx11_(value *this,char *path,char *def)

{
  bool bVar1;
  char *in_RCX;
  string *in_RDI;
  bad_cast *e;
  value *v;
  value *in_stack_ffffffffffffff78;
  allocator local_29;
  value *local_28;
  char *local_20;
  
  local_20 = in_RCX;
  local_28 = find((value *)def,(char *)v);
  bVar1 = is_undefined((value *)0x368ac9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_20,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    get_value<std::__cxx11::string>(in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

std::string get(char const *path,char const *def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<std::string>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}